

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adksys_procfs.c
# Opt level: O3

int adksys_get_cmdline_buffer(char **output_buffer,int *output_size)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *__ptr;
  int *piVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  __stream = fopen("/proc/self/cmdline","r");
  iVar2 = -1;
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    sVar4 = 0;
    while (iVar1 == 0) {
      fgetc(__stream);
      sVar4 = sVar4 + 1;
      iVar1 = feof(__stream);
    }
    __ptr = (char *)calloc(1,sVar4);
    if (__ptr == (char *)0x0) {
      fclose(__stream);
    }
    else {
      uVar5 = sVar4 - 1;
      uVar6 = 0;
      fseek(__stream,0,0);
      do {
        sVar4 = fread(__ptr + uVar6,1,uVar5 - uVar6,__stream);
        if (sVar4 == 0) {
          piVar3 = __errno_location();
          if (*piVar3 != 4) {
            iVar2 = feof(__stream);
            if (iVar2 == 0) {
              fclose(__stream);
              if (__ptr == (char *)0x0) {
                return -1;
              }
              free(__ptr);
              return -1;
            }
            break;
          }
        }
        else {
          uVar6 = uVar6 + sVar4;
        }
      } while (uVar6 < uVar5);
      fclose(__stream);
      *output_buffer = __ptr;
      *output_size = (int)uVar5;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int adksys_get_cmdline_buffer(char **output_buffer, int *output_size)
{
   FILE *f = NULL;
   size_t bytes_read = 0, size = 0;
   char *buffer = NULL;
   size_t result;
   
   f = fopen("/proc/self/cmdline", "r");
   if (!f)
      goto error;
   while (!feof(f)) {
      fgetc(f);
      size += 1;
   }
   size--;
   buffer = (char *) malloc(size+1);
   if (!buffer)
      goto error;
   memset(buffer, 0, size+1);
   
   result = fseek(f, SEEK_SET, 0);
   do {
      result = fread(buffer + bytes_read, 1, size - bytes_read, f);
      if (result == 0 && errno == EINTR)
         continue;
      else if (result == 0 && feof(f))
         break;
      else if (result == 0)
         goto error;
      bytes_read += result;
   } while (bytes_read < size);

   fclose(f);
   *output_buffer = buffer;
   *output_size = size;
   return 0;
   
  error:
   if (f)
      fclose(f);
   if (buffer)
      free(buffer);
   return -1;
}